

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O1

long __thiscall gl4cts::anon_unknown_0::NegativeAPIBlockBinding::Run(NegativeAPIBlockBinding *this)

{
  bool bVar1;
  GLuint shader;
  GLuint program;
  GLenum GVar2;
  CallLogWrapper *this_00;
  char *format;
  long lVar3;
  GLint bindings;
  char *glsl_vs;
  GLuint local_34;
  char *local_30;
  
  bVar1 = ShaderStorageBufferObjectBase::SupportedInVS(&this->super_ShaderStorageBufferObjectBase,1)
  ;
  if (!bVar1) {
    return 0x10;
  }
  this_00 = &(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glGetIntegerv(this_00,0x90dd,(GLint *)&local_34);
  local_30 = "#version 430 core\nbuffer Buffer {\n  int x;\n};\nvoid main() {\n  x = 0;\n}";
  shader = glu::CallLogWrapper::glCreateShader(this_00,0x8b31);
  glu::CallLogWrapper::glShaderSource(this_00,shader,1,&local_30,(GLint *)0x0);
  glu::CallLogWrapper::glCompileShader(this_00,shader);
  program = glu::CallLogWrapper::glCreateProgram(this_00);
  glu::CallLogWrapper::glAttachShader(this_00,program,shader);
  glu::CallLogWrapper::glDeleteShader(this_00,shader);
  glu::CallLogWrapper::glLinkProgram(this_00,program);
  glu::CallLogWrapper::glShaderStorageBlockBinding(this_00,program,0,local_34);
  GVar2 = glu::CallLogWrapper::glGetError(this_00);
  if (GVar2 == 0x501) {
    glu::CallLogWrapper::glShaderStorageBlockBinding(this_00,program,1,0);
    GVar2 = glu::CallLogWrapper::glGetError(this_00);
    if (GVar2 == 0x501) {
      glu::CallLogWrapper::glShaderStorageBlockBinding(this_00,0,0,0);
      GVar2 = glu::CallLogWrapper::glGetError(this_00);
      if (GVar2 == 0x501) {
        lVar3 = 0;
        glu::CallLogWrapper::glShaderStorageBlockBinding(this_00,shader,0,0);
        GVar2 = glu::CallLogWrapper::glGetError(this_00);
        if (GVar2 == 0x502) goto LAB_00973f1c;
        format = 
        "An INVALID_OPERATION error is generated if program is the name of a shader object.\n";
      }
      else {
        format = 
        "An INVALID_VALUE error is generated if program is not the name of either a program or shader object.\n"
        ;
      }
    }
    else {
      format = 
      "An INVALID_VALUE error is generated if storageBlockIndex is not an\nactive shader storage block index in program.\n"
      ;
    }
  }
  else {
    format = 
    "An INVALID_VALUE error is generated if storageBlockBinding is\ngreater than or equal to the value of MAX_SHADER_STORAGE_BUFFER_BINDINGS.\n"
    ;
  }
  anon_unknown_0::Output(format);
  lVar3 = -1;
LAB_00973f1c:
  glu::CallLogWrapper::glDeleteProgram(this_00,program);
  return lVar3;
}

Assistant:

virtual long Run()
	{
		if (!SupportedInVS(1))
			return NOT_SUPPORTED;
		GLint bindings;
		glGetIntegerv(GL_MAX_SHADER_STORAGE_BUFFER_BINDINGS, &bindings);

		const char* const glsl_vs =
			"#version 430 core" NL "buffer Buffer {" NL "  int x;" NL "};" NL "void main() {" NL "  x = 0;" NL "}";
		const GLuint sh = glCreateShader(GL_VERTEX_SHADER);
		glShaderSource(sh, 1, &glsl_vs, NULL);
		glCompileShader(sh);

		const GLuint p = glCreateProgram();
		glAttachShader(p, sh);
		glDeleteShader(sh);
		glLinkProgram(p);

		glShaderStorageBlockBinding(p, 0, bindings);
		if (glGetError() != GL_INVALID_VALUE)
		{
			Output("An INVALID_VALUE error is generated if storageBlockBinding is\n"
				   "greater than or equal to the value of MAX_SHADER_STORAGE_BUFFER_BINDINGS.\n");
			glDeleteProgram(p);
			return ERROR;
		}

		glShaderStorageBlockBinding(p, 1, 0);
		if (glGetError() != GL_INVALID_VALUE)
		{
			Output("An INVALID_VALUE error is generated if storageBlockIndex is not an\n"
				   "active shader storage block index in program.\n");
			glDeleteProgram(p);
			return ERROR;
		}

		glShaderStorageBlockBinding(0, 0, 0);
		if (glGetError() != GL_INVALID_VALUE)
		{
			Output("An INVALID_VALUE error is generated if program is not the name of either a program or shader "
				   "object.\n");
			glDeleteProgram(p);
			return ERROR;
		}

		glShaderStorageBlockBinding(sh, 0, 0);
		if (glGetError() != GL_INVALID_OPERATION)
		{
			Output("An INVALID_OPERATION error is generated if program is the name of a shader object.\n");
			glDeleteProgram(p);
			return ERROR;
		}

		glDeleteProgram(p);
		return NO_ERROR;
	}